

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

RefAST __thiscall antlr::ASTFactory::create(ASTFactory *this,RefToken *tok)

{
  int iVar1;
  long *in_RDX;
  _func_int *p_Var2;
  TokenRefCount<antlr::Token> local_20;
  
  iVar1 = (**(code **)(**(long **)*in_RDX + 0x30))();
  (*(code *)(&(tok[3].ref)->ptr)[iVar1]->ref)();
  if (this->_vptr_ASTFactory == (_func_int **)0x0) {
    p_Var2 = (_func_int *)0x0;
  }
  else {
    p_Var2 = *this->_vptr_ASTFactory;
  }
  local_20.ref = (TokenRef *)*in_RDX;
  if (local_20.ref != (TokenRef *)0x0) {
    (local_20.ref)->count = (local_20.ref)->count + 1;
  }
  (**(code **)(*(long *)p_Var2 + 0x98))();
  TokenRefCount<antlr::Token>::~TokenRefCount(&local_20);
  return (RefAST)(ASTRef *)this;
}

Assistant:

RefAST ASTFactory::create(RefToken tok)
{
//	cout << "create( tok="<< tok->getType() << ", " << tok->getText() << ")" << nodeFactories.size() << endl;
	RefAST t = nodeFactories[tok->getType()]->second();
	t->initialize(tok);
	return t;
}